

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall Omega_h::get_curvature_metrics(Omega_h *this,Mesh *mesh,Real segment_angle)

{
  int *piVar1;
  Alloc *pAVar2;
  Reals *pRVar3;
  double ****ppppdVar4;
  double ***pppdVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  Int j;
  LO LVar13;
  double ****ppppdVar14;
  long *plVar15;
  long lVar16;
  Int i_4;
  double *****pppppdVar17;
  undefined8 uVar18;
  bool bVar19;
  Int i;
  undefined1 (*pauVar20) [16];
  double *****pppppdVar21;
  double *pdVar22;
  void *extraout_RDX;
  int iVar23;
  ulong uVar24;
  long lVar25;
  SurfaceInfo *this_00;
  long lVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  Real a;
  double ****ppppdVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Real d;
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double ***pppdVar45;
  Reals RVar46;
  ScopedTimer omega_h_scoped_function_timer;
  Matrix<3,_3> m;
  Write<double> out;
  Vector<3> c_6;
  size_type __dnew;
  Vector<3> c_10;
  Vector<3> c_5;
  Vector<3> c_8;
  Matrix<2,_3> m_q_inv;
  Vector<3> c_13;
  Vector<3> c_3;
  Matrix<2,_2> c_1;
  Matrix<2,_3> surf_frame;
  type f;
  Matrix<3,_2> c_7;
  type m_q;
  SurfaceInfo surface_info;
  ScopedTimer local_569;
  double *****local_568;
  double ****appppdStack_560 [2];
  double adStack_550 [5];
  undefined8 local_528;
  double ****local_518 [2];
  double ****local_508;
  double ****ppppdStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  Write<double> local_4e8;
  ulong local_4d0;
  double ****local_4c8 [4];
  Real local_4a8;
  double ****local_4a0;
  long lStack_498;
  double ****local_490;
  double ****ppppdStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  char *local_470;
  Write<double> local_468;
  double ****local_458 [4];
  double ***pppdStack_438;
  double ***local_430;
  double ****local_428;
  double ***pppdStack_420;
  double ***local_418;
  Write<double> local_410;
  Write<double> local_400;
  SurfaceInfo local_3f0;
  Real local_390;
  Alloc *local_388;
  void *local_380;
  undefined1 local_378 [16];
  Alloc *local_360;
  double local_358;
  long local_350;
  double ****local_348;
  double ***apppdStack_340 [2];
  double dStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  double ****local_318;
  double ***pppdStack_310;
  double ***local_308;
  double ****local_2f8 [4];
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  double local_298;
  undefined8 uStack_290;
  double local_288;
  double dStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  double ****local_258 [3];
  double dStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  SurfaceInfo local_228;
  Real local_1c8;
  Alloc *local_1c0;
  void *pvStack_1b8;
  double ****local_1b0 [2];
  double ***local_1a0;
  double ****local_198 [2];
  double ***local_188;
  double ****local_180 [2];
  double ***local_170;
  double ****local_168 [2];
  double ***local_158;
  SurfaceInfo local_150;
  SurfaceInfo local_f0;
  SurfaceInfo local_90;
  
  local_4a8 = segment_angle;
  get_surface_info(&local_150,mesh);
  LVar13 = Mesh::nverts(mesh);
  uVar6 = mesh->dim_;
  if (3 < uVar6) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  pRVar3 = &local_3f0.surf_vert_normals;
  local_3f0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)pRVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
  Write<double>::Write(&local_4e8,((uVar6 + 1) * uVar6 >> 1) * LVar13,0.0,(string *)&local_3f0);
  if (local_3f0.surf_vert2vert.write_.shared_alloc_.alloc != (Alloc *)pRVar3) {
    operator_delete(local_3f0.surf_vert2vert.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_3f0.surf_vert_normals.write_.shared_alloc_.alloc)->size +
                           1));
  }
  uVar6 = mesh->dim_;
  if (3 < uVar6) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (uVar6 == 2) {
    SurfaceInfo::SurfaceInfo(&local_f0,&local_150);
    local_410.shared_alloc_.alloc = local_4e8.shared_alloc_.alloc;
    if (((ulong)local_4e8.shared_alloc_.alloc & 7) == 0 &&
        local_4e8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_410.shared_alloc_.alloc = (Alloc *)((local_4e8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4e8.shared_alloc_.alloc)->use_count = (local_4e8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_410.shared_alloc_.direct_ptr = local_4e8.shared_alloc_.direct_ptr;
    get_curve_curvature_metrics<2>(&local_f0,local_4a8,&local_410);
    pAVar2 = local_410.shared_alloc_.alloc;
    if (((ulong)local_410.shared_alloc_.alloc & 7) == 0 &&
        local_410.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_410.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_410.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    this_00 = &local_f0;
  }
  else {
    if (uVar6 != 3) goto LAB_003384f5;
    SurfaceInfo::SurfaceInfo(&local_228,&local_150);
    local_1c8 = local_4a8;
    local_1c0 = local_4e8.shared_alloc_.alloc;
    if (((ulong)local_4e8.shared_alloc_.alloc & 7) == 0 &&
        local_4e8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1c0 = (Alloc *)((local_4e8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4e8.shared_alloc_.alloc)->use_count = (local_4e8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pvStack_1b8 = local_4e8.shared_alloc_.direct_ptr;
    if (((ulong)local_150.surf_vert2vert.write_.shared_alloc_.alloc & 1) == 0) {
      uVar24 = (local_150.surf_vert2vert.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar24 = (ulong)local_150.surf_vert2vert.write_.shared_alloc_.alloc >> 3;
    }
    local_518[0] = (double ****)&local_508;
    local_4a0 = (double ****)0x5d;
    ppppdVar14 = (double ****)std::__cxx11::string::_M_create((ulong *)local_518,(ulong)&local_4a0);
    ppppdVar29 = local_4a0;
    local_508 = local_4a0;
    local_518[0] = ppppdVar14;
    memcpy(ppppdVar14,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
           ,0x5d);
    local_518[1] = ppppdVar29;
    *(undefined1 *)((long)ppppdVar14 + (long)ppppdVar29) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)local_518);
    pppppdVar17 = appppdStack_560 + 1;
    pppppdVar21 = (double *****)(plVar15 + 2);
    if ((double *****)*plVar15 == pppppdVar21) {
      appppdStack_560[1] = *pppppdVar21;
      adStack_550[0] = (double)plVar15[3];
      local_568 = pppppdVar17;
    }
    else {
      appppdStack_560[1] = *pppppdVar21;
      local_568 = (double *****)*plVar15;
    }
    appppdStack_560[0] = (double ****)plVar15[1];
    *plVar15 = (long)pppppdVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    local_4a0 = (double ****)&local_490;
    std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x02');
    *(undefined2 *)local_4a0 = 0x3438;
    ppppdVar29 = (double ****)0xf;
    if (local_568 != pppppdVar17) {
      ppppdVar29 = appppdStack_560[1];
    }
    if (ppppdVar29 < (double ****)(lStack_498 + (long)appppdStack_560[0])) {
      ppppdVar29 = (double ****)0xf;
      if ((double *****)local_4a0 != &local_490) {
        ppppdVar29 = local_490;
      }
      if (ppppdVar29 < (double ****)(lStack_498 + (long)appppdStack_560[0])) goto LAB_00337666;
      plVar15 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_4a0,0,(char *)0x0,(ulong)local_568);
    }
    else {
LAB_00337666:
      plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_568,(ulong)local_4a0);
    }
    pAVar2 = (Alloc *)(plVar15 + 2);
    if ((Alloc *)*plVar15 == pAVar2) {
      local_3f0.surf_vert_normals.write_.shared_alloc_.alloc = (Alloc *)pAVar2->size;
      local_3f0.surf_vert_normals.write_.shared_alloc_.direct_ptr = (void *)plVar15[3];
      local_3f0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)pRVar3;
    }
    else {
      local_3f0.surf_vert_normals.write_.shared_alloc_.alloc = (Alloc *)pAVar2->size;
      local_3f0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)*plVar15;
    }
    local_3f0.surf_vert2vert.write_.shared_alloc_.direct_ptr = (void *)plVar15[1];
    *plVar15 = (long)pAVar2;
    plVar15[1] = 0;
    *(undefined1 *)&pAVar2->size = 0;
    begin_code("parallel_for",(char *)local_3f0.surf_vert2vert.write_.shared_alloc_.alloc);
    if (local_3f0.surf_vert2vert.write_.shared_alloc_.alloc != (Alloc *)pRVar3) {
      operator_delete(local_3f0.surf_vert2vert.write_.shared_alloc_.alloc,
                      (ulong)((long)&(local_3f0.surf_vert_normals.write_.shared_alloc_.alloc)->size
                             + 1));
    }
    if ((double *****)local_4a0 != &local_490) {
      operator_delete(local_4a0,(long)local_490 + 1);
    }
    local_4d0 = uVar24 >> 2;
    if (local_568 != pppppdVar17) {
      operator_delete(local_568,(long)appppdStack_560[1] + 1);
    }
    iVar23 = (int)local_4d0;
    if ((double *****)local_518[0] != &local_508) {
      operator_delete(local_518[0],(long)local_508 + 1);
      iVar23 = (int)local_4d0;
    }
    if (0 < iVar23) {
      entering_parallel = '\x01';
      SurfaceInfo::SurfaceInfo(&local_3f0,&local_228);
      local_390 = local_1c8;
      local_388 = local_1c0;
      local_380 = pvStack_1b8;
      if ((((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_1c0->use_count = local_1c0->use_count + -1;
        local_388 = (Alloc *)(local_1c0->size * 8 + 1);
      }
      local_1c0 = (Alloc *)0x0;
      pvStack_1b8 = (void *)0x0;
      entering_parallel = '\0';
      lVar16 = 0;
      local_470 = "best_norm > EPSILON";
      uVar24 = local_4d0;
      local_360 = (Alloc *)this;
      do {
        lVar26 = (lVar16 << 0x20) * 3 >> 0x1d;
        auVar40 = *(undefined1 (*) [16])
                   ((long)local_3f0.surf_vert_IIs.write_.shared_alloc_.direct_ptr + lVar26);
        appppdStack_560[0] =
             *(double *****)
              ((long)local_3f0.surf_vert_IIs.write_.shared_alloc_.direct_ptr + lVar26 + 0x10);
        local_568 = (double *****)auVar40._0_8_;
        appppdStack_560[1] = appppdStack_560[0];
        adStack_550[0] = auVar40._8_8_;
        pppppdVar17 = (double *****)&local_568;
        dVar37 = 0.0;
        bVar11 = true;
        do {
          bVar12 = bVar11;
          lVar25 = 0;
          dVar38 = dVar37;
          bVar11 = true;
          do {
            bVar19 = bVar11;
            dVar37 = ABS((double)pppppdVar17[lVar25]);
            if (ABS((double)pppppdVar17[lVar25]) <= dVar38) {
              dVar37 = dVar38;
            }
            lVar25 = 1;
            dVar38 = dVar37;
            bVar11 = false;
          } while (bVar19);
          pppppdVar17 = appppdStack_560 + 1;
          bVar11 = false;
        } while (bVar12);
        local_350 = lVar16;
        if (dVar37 <= 1e-10) {
          local_518[1] = (double ****)0x0;
          local_508 = (double ****)0x0;
          dVar37 = 0.0;
          dVar38 = 0.0;
          local_518[0]._0_4_ = 0;
          local_518[0]._4_4_ = 0x3ff00000;
          uVar27 = 0;
          uVar28 = 0x3ff00000;
        }
        else {
          auVar7._8_4_ = SUB84(dVar37,0);
          auVar7._0_8_ = dVar37;
          auVar7._12_4_ = (int)((ulong)dVar37 >> 0x20);
          auVar40 = divpd(auVar40,auVar7);
          dVar41 = (double)appppdStack_560[0] / dVar37;
          dVar42 = auVar40._8_8_;
          dVar39 = auVar40._0_8_;
          dVar35 = dVar39 + dVar42;
          dVar43 = dVar41 * dVar41;
          dVar38 = (dVar39 * dVar42 - dVar43) * -4.0 + dVar35 * dVar35;
          if (5e-05 <= ABS(dVar38)) {
            if (dVar38 <= 0.0) {
              uVar18 = 0x119;
              local_470 = "nroots == 1 && roots_obj.mults[0] == 2";
LAB_003385f2:
              appppdStack_560[0] = appppdStack_560[1];
              fail("assertion %s failed at %s +%d\n",local_470,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
                   ,uVar18);
            }
            dVar44 = SQRT(dVar38);
            uStack_290 = 0;
            uStack_2b0 = 0;
            uStack_2d0 = 0;
            dVar36 = dVar44;
            local_2a8._0_8_ = dVar39;
            local_2d8 = dVar43;
            local_2c8 = dVar42;
            dStack_2c0 = dVar42;
            local_2b8 = dVar41;
            local_298 = dVar37;
            local_288 = dVar35;
            dStack_280 = dVar42;
            if (dVar38 < 0.0) {
              local_378._8_4_ = auVar40._8_4_;
              local_378._0_8_ = dVar38;
              local_378._12_4_ = auVar40._12_4_;
              local_358 = dVar44;
              local_2a8 = auVar40;
              dVar44 = sqrt(dVar38);
              uVar24 = local_4d0;
              dVar38 = (double)local_378._0_8_;
              dVar36 = local_358;
              auVar40 = local_2a8;
            }
            local_2a8 = auVar40;
            dVar35 = (double)local_2a8._0_8_;
            if (dVar38 < 0.0) {
              local_378._0_8_ = dVar44;
              dVar36 = sqrt(dVar38);
              uVar24 = local_4d0;
              dVar44 = (double)local_378._0_8_;
              dVar35 = (double)local_2a8._0_8_;
            }
            dVar37 = local_298;
            appppdStack_560[0] = (double ****)local_2b8;
            dVar42 = dStack_2c0;
            dVar39 = local_2c8;
            dVar38 = local_2d8;
            dVar36 = local_288 - dVar36;
            ppppdVar29 = (double ****)local_258;
            pauVar20 = (undefined1 (*) [16])local_518;
            dVar41 = dVar44 + local_288;
            bVar11 = true;
            do {
              bVar12 = bVar11;
              pppdVar45 = (double ***)(dVar41 * 0.5);
              local_568 = (double *****)(dVar35 - (double)pppdVar45);
              auVar30._0_8_ = dVar39 - (double)pppdVar45;
              auVar30._8_8_ = dVar42;
              appppdStack_560[1] = appppdStack_560[0];
              adStack_550[0] = auVar30._0_8_;
              dVar41 = auVar30._0_8_ * auVar30._0_8_ + dVar38;
              auVar40._8_4_ = SUB84(dVar41,0);
              auVar40._0_8_ =
                   (double)appppdStack_560[0] * (double)appppdStack_560[0] +
                   (double)local_568 * (double)local_568;
              auVar40._12_4_ = (int)((ulong)dVar41 >> 0x20);
              auVar40 = sqrtpd(auVar30,auVar40);
              uVar27 = auVar40._8_4_;
              uVar28 = auVar40._12_4_;
              if (auVar40._8_8_ <= auVar40._0_8_) {
                uVar27 = auVar40._0_4_;
                uVar28 = auVar40._4_4_;
              }
              if ((double)CONCAT44(uVar28,uVar27) < 1e-10 ||
                  (double)CONCAT44(uVar28,uVar27) == 1e-10) {
                uVar18 = 0xd3;
                goto LAB_003385f2;
              }
              uVar10 = (ulong)(auVar40._0_8_ < auVar40._8_8_);
              auVar31._0_8_ = *(ulong *)((long)appppdStack_560 + uVar10 * 0x10) ^ 0x8000000000000000
              ;
              auVar31._8_8_ = (&local_568)[uVar10 * 2];
              auVar9._4_4_ = uVar28;
              auVar9._0_4_ = uVar27;
              auVar9._8_4_ = uVar27;
              auVar9._12_4_ = uVar28;
              auVar40 = divpd(auVar31,auVar9);
              *pauVar20 = auVar40;
              *ppppdVar29 = pppdVar45;
              ppppdVar29 = (double ****)&local_348;
              pauVar20 = (undefined1 (*) [16])&local_508;
              dVar41 = dVar36;
              bVar11 = false;
            } while (bVar12);
            uVar27 = SUB84(ppppdStack_500,0);
            uVar28 = (undefined4)((ulong)ppppdStack_500 >> 0x20);
            ppppdVar14 = local_348;
            ppppdVar29 = local_258[0];
          }
          else {
            local_518[1] = (double ****)0x0;
            local_508 = (double ****)0x0;
            local_518[0]._0_4_ = 0;
            local_518[0]._4_4_ = 0x3ff00000;
            uVar27 = 0;
            uVar28 = 0x3ff00000;
            ppppdVar14 = (double ****)(dVar35 * 0.5);
            ppppdVar29 = (double ****)(dVar35 * 0.5);
          }
          dVar38 = (double)ppppdVar29 * dVar37;
          dVar37 = (double)ppppdVar14 * dVar37;
        }
        pAVar2 = local_388;
        dVar35 = *(double *)
                  ((long)local_3f0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar26);
        dVar39 = *(double *)
                  ((long)local_3f0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar26 + 8);
        dVar42 = *(double *)
                  ((long)local_3f0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar26 + 0x10
                  );
        dVar41 = (double)((ulong)dVar42 & 0x8000000000000000 | (ulong)DAT_00449120);
        dVar42 = -1.0 / (dVar42 + dVar41);
        adStack_550[0] = dVar35 * dVar39 * dVar42;
        local_568 = (double *****)(dVar35 * dVar41 * dVar35 * dVar42 + 1.0);
        appppdStack_560[0] = (double ****)(adStack_550[0] * dVar41);
        appppdStack_560[1] = (double ****)(-dVar41 * dVar35);
        adStack_550[1] = dVar39 * dVar39 * dVar42 + dVar41;
        adStack_550[2] = -dVar39;
        lVar16 = 0;
        do {
          uVar18 = *(undefined8 *)((long)adStack_550 + lVar16);
          *(undefined8 *)((long)local_258 + lVar16 * 2) = *(undefined8 *)((long)&local_568 + lVar16)
          ;
          *(undefined8 *)((long)local_258 + lVar16 * 2 + 8) = uVar18;
          lVar16 = lVar16 + 8;
        } while (lVar16 != 0x18);
        adStack_550[1] = (double)local_238;
        adStack_550[2] = (double)uStack_230;
        appppdStack_560[1] = local_258[2];
        adStack_550[0] = dStack_240;
        local_568 = (double *****)local_258[0];
        appppdStack_560[0] = local_258[1];
        lVar16 = 0;
        do {
          *(double *)((long)&local_348 + lVar16) =
               *(double *)((long)&local_568 + lVar16) *
               (double)CONCAT44(local_518[0]._4_4_,local_518[0]._0_4_) +
               (double)local_508 * *(double *)((long)appppdStack_560 + lVar16);
          *(double *)((long)apppdStack_340 + lVar16) =
               *(double *)((long)appppdStack_560 + lVar16) * (double)CONCAT44(uVar28,uVar27) +
               (double)local_518[1] * *(double *)((long)&local_568 + lVar16);
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x30);
        adStack_550[1] = (double)local_328;
        adStack_550[2] = (double)uStack_320;
        appppdStack_560[1] = (double ****)apppdStack_340[1];
        adStack_550[0] = dStack_330;
        local_568 = (double *****)local_348;
        appppdStack_560[0] = (double ****)apppdStack_340[0];
        pppppdVar17 = &local_4a0;
        pppppdVar21 = (double *****)&local_568;
        bVar11 = true;
        do {
          bVar12 = bVar11;
          lVar16 = 0;
          do {
            *(undefined8 *)((long)pppppdVar17 + lVar16) =
                 *(undefined8 *)((long)pppppdVar21 + lVar16 * 2);
            lVar16 = lVar16 + 8;
          } while (lVar16 != 0x18);
          pppppdVar17 = &ppppdStack_488;
          pppppdVar21 = appppdStack_560;
          bVar11 = false;
        } while (bVar12);
        local_4f8 = local_480;
        uStack_4f0 = uStack_478;
        local_508 = local_490;
        ppppdStack_500 = ppppdStack_488;
        local_518[0] = local_4a0;
        local_518[1] = (double ****)lStack_498;
        pppppdVar17 = local_458;
        pppppdVar21 = local_518;
        bVar11 = true;
        do {
          bVar12 = bVar11;
          local_4c8[0] = *pppppdVar21;
          local_4c8[1] = pppppdVar21[1];
          local_4c8[2] = pppppdVar21[2];
          ppppdVar29 = (double ****)((double)local_4c8[0] * (double)local_348);
          ppppdVar14 = (double ****)((double)local_4c8[0] * (double)apppdStack_340[0]);
          lVar16 = 8;
          do {
            ppppdVar29 = (double ****)
                         ((double)ppppdVar29 +
                         *(double *)((long)local_4c8 + lVar16) *
                         *(double *)((long)&local_568 + lVar16 * 2));
            ppppdVar14 = (double ****)
                         ((double)ppppdVar14 +
                         *(double *)((long)local_4c8 + lVar16) *
                         *(double *)((long)appppdStack_560 + lVar16 * 2));
            lVar16 = lVar16 + 8;
          } while (lVar16 != 0x18);
          *pppppdVar17 = ppppdVar29;
          pppppdVar17[1] = ppppdVar14;
          pppppdVar17 = &local_428;
          pppppdVar21 = &ppppdStack_500;
          bVar11 = false;
        } while (bVar12);
        auVar33._0_8_ = (ulong)local_428 ^ 0x8000000000000000;
        auVar33._8_8_ = local_458[0];
        auVar32._0_8_ =
             (double)local_458[0] * (double)pppdStack_420 - (double)local_458[1] * (double)local_428
        ;
        auVar34._8_8_ = -(double)local_458[1];
        auVar34._0_8_ = pppdStack_420;
        auVar32._8_8_ = auVar32._0_8_;
        local_278 = divpd(auVar34,auVar32);
        local_268 = divpd(auVar33,auVar32);
        ppppdVar29 = (double ****)local_180;
        pdVar22 = (double *)local_278;
        bVar11 = true;
        do {
          bVar12 = bVar11;
          dVar35 = *pdVar22;
          dVar39 = pdVar22[1];
          appppdStack_560[1] = local_490;
          local_568 = (double *****)local_4a0;
          appppdStack_560[0] = (double ****)lStack_498;
          lVar16 = 0;
          do {
            local_2f8[lVar16] = (double ****)((double)(&local_568)[lVar16] * dVar35);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          appppdStack_560[1] = (double ****)uStack_478;
          local_568 = (double *****)ppppdStack_488;
          appppdStack_560[0] = (double ****)local_480;
          lVar16 = 0;
          do {
            local_458[lVar16 + 3] = (double ****)((double)(&local_568)[lVar16] * dVar39);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          appppdStack_560[1] = (double ****)local_430;
          local_568 = (double *****)local_458[3];
          appppdStack_560[0] = (double ****)pppdStack_438;
          local_518[0] = local_2f8[0];
          local_518[1] = local_2f8[1];
          local_508 = local_2f8[2];
          lVar16 = 0;
          do {
            local_4c8[lVar16] =
                 (double ****)((double)local_518[lVar16] + (double)(&local_568)[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_2f8[0] = local_4c8[0];
          local_2f8[1] = local_4c8[1];
          local_2f8[2] = local_4c8[2];
          ppppdVar29[2] = (double ***)local_4c8[2];
          *ppppdVar29 = (double ***)local_4c8[0];
          ppppdVar29[1] = (double ***)local_4c8[1];
          ppppdVar29 = (double ****)local_168;
          pdVar22 = (double *)local_268;
          bVar11 = false;
        } while (bVar12);
        local_568 = (double *****)((dVar38 / local_390) * (dVar38 / local_390));
        appppdStack_560[0] = (double ****)0x0;
        appppdStack_560[1] = (double ****)0x0;
        adStack_550[0] = (dVar37 / local_390) * (dVar37 / local_390);
        ppppdVar29 = (double ****)local_1b0;
        pppppdVar17 = (double *****)&local_568;
        bVar11 = true;
        do {
          bVar12 = bVar11;
          ppppdVar14 = *pppppdVar17;
          ppppdVar4 = pppppdVar17[1];
          local_508 = (double ****)local_170;
          local_518[0] = local_180[0];
          local_518[1] = local_180[1];
          lVar16 = 0;
          do {
            local_458[lVar16 + 6] = (double ****)((double)local_518[lVar16] * (double)ppppdVar14);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_508 = (double ****)local_158;
          local_518[0] = local_168[0];
          local_518[1] = local_168[1];
          lVar16 = 0;
          do {
            local_458[lVar16] = (double ****)((double)local_518[lVar16] * (double)ppppdVar4);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_508 = local_458[2];
          local_518[0] = local_458[0];
          local_518[1] = local_458[1];
          local_4c8[0] = local_428;
          local_4c8[1] = (double ****)pppdStack_420;
          local_4c8[2] = (double ****)local_418;
          lVar16 = 0;
          do {
            local_458[lVar16 + 3] =
                 (double ****)((double)local_4c8[lVar16] + (double)local_518[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_428 = local_458[3];
          pppdStack_420 = pppdStack_438;
          local_418 = local_430;
          ppppdVar29[2] = local_430;
          *ppppdVar29 = (double ***)local_458[3];
          ppppdVar29[1] = pppdStack_438;
          ppppdVar29 = (double ****)local_198;
          pppppdVar17 = appppdStack_560 + 1;
          bVar11 = false;
        } while (bVar12);
        lVar16 = 0;
        do {
          pppdVar45 = (double ***)(&local_348)[lVar16 * 2];
          pppdVar5 = (double ***)(&local_348)[lVar16 * 2 + 1];
          local_508 = (double ****)local_1a0;
          local_518[0] = local_1b0[0];
          local_518[1] = local_1b0[1];
          lVar26 = 0;
          do {
            (&local_348)[lVar26 + 6] = (double ****)((double)local_518[lVar26] * (double)pppdVar45);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          local_508 = (double ****)local_188;
          local_518[0] = local_198[0];
          local_518[1] = local_198[1];
          lVar26 = 0;
          do {
            local_458[lVar26] = (double ****)((double)local_518[lVar26] * (double)pppdVar5);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          local_508 = local_458[2];
          local_518[0] = local_458[0];
          local_518[1] = local_458[1];
          local_4c8[0] = local_318;
          local_4c8[1] = (double ****)pppdStack_310;
          local_4c8[2] = (double ****)local_308;
          lVar26 = 0;
          do {
            local_458[lVar26 + 3] =
                 (double ****)((double)local_4c8[lVar26] + (double)local_518[lVar26]);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          local_318 = local_458[3];
          pppdStack_310 = pppdStack_438;
          local_308 = local_430;
          adStack_550[lVar16 * 3 + -1] = (double)local_430;
          (&local_568)[lVar16 * 3] = (double *****)local_458[3];
          *(double ****)((long)appppdStack_560 + lVar16 * 0x18) = pppdStack_438;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        lVar16 = (long)*(int *)((long)local_3f0.surf_vert2vert.write_.shared_alloc_.direct_ptr +
                               local_350 * 4) * 0x30;
        *(double ******)((long)local_380 + lVar16) = local_568;
        *(double *)((long)local_380 + lVar16 + 8) = adStack_550[1];
        *(undefined8 *)((long)local_380 + lVar16 + 0x10) = local_528;
        *(double *)((long)local_380 + lVar16 + 0x18) = adStack_550[0];
        auVar8._8_4_ = adStack_550[3]._0_4_;
        auVar8._0_8_ = adStack_550[4];
        auVar8._12_4_ = adStack_550[3]._4_4_;
        *(undefined1 (*) [16])((long)local_380 + lVar16 + 0x20) = auVar8;
        lVar16 = local_350 + 1;
      } while ((int)lVar16 != (int)uVar24);
      if (((ulong)local_388 & 7) == 0 && local_388 != (Alloc *)0x0) {
        piVar1 = &local_388->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_388);
          operator_delete(pAVar2,0x48);
        }
      }
      SurfaceInfo::~SurfaceInfo(&local_3f0);
      this = (Omega_h *)local_360;
    }
    ScopedTimer::~ScopedTimer(&local_569);
    SurfaceInfo::SurfaceInfo(&local_90,&local_150);
    local_400.shared_alloc_.alloc = local_4e8.shared_alloc_.alloc;
    if (((ulong)local_4e8.shared_alloc_.alloc & 7) == 0 &&
        local_4e8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_400.shared_alloc_.alloc = (Alloc *)((local_4e8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4e8.shared_alloc_.alloc)->use_count = (local_4e8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_400.shared_alloc_.direct_ptr = local_4e8.shared_alloc_.direct_ptr;
    get_curve_curvature_metrics<3>(&local_90,local_4a8,&local_400);
    pAVar2 = local_400.shared_alloc_.alloc;
    if (((ulong)local_400.shared_alloc_.alloc & 7) == 0 &&
        local_400.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_400.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_400.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    SurfaceInfo::~SurfaceInfo(&local_90);
    pAVar2 = local_1c0;
    if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
      piVar1 = &local_1c0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1c0);
        operator_delete(pAVar2,0x48);
      }
    }
    this_00 = &local_228;
  }
  SurfaceInfo::~SurfaceInfo(this_00);
LAB_003384f5:
  local_468.shared_alloc_.alloc = local_4e8.shared_alloc_.alloc;
  local_468.shared_alloc_.direct_ptr = local_4e8.shared_alloc_.direct_ptr;
  if ((((ulong)local_4e8.shared_alloc_.alloc & 7) == 0 &&
       local_4e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_4e8.shared_alloc_.alloc)->use_count = (local_4e8.shared_alloc_.alloc)->use_count + -1;
    local_468.shared_alloc_.alloc = (Alloc *)((local_4e8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_4e8.shared_alloc_.alloc = (Alloc *)0x0;
  local_4e8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_468);
  pAVar2 = local_468.shared_alloc_.alloc;
  if (((ulong)local_468.shared_alloc_.alloc & 7) == 0 &&
      local_468.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_468.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_468.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_4e8.shared_alloc_.alloc;
  if (((ulong)local_4e8.shared_alloc_.alloc & 7) == 0 &&
      local_4e8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_4e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_4e8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  SurfaceInfo::~SurfaceInfo(&local_150);
  RVar46.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar46.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar46.write_.shared_alloc_;
}

Assistant:

Reals get_curvature_metrics(Mesh* mesh, Real segment_angle) {
  auto surface_info = get_surface_info(mesh);
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(mesh->dim()), 0.0);
  if (mesh->dim() == 3) {
    /* this algorithm creates degenerate metrics that only specify size in
       the two tangential directions to mesh surfaces */
    auto f = OMEGA_H_LAMBDA(LO const surf_vert) {
      auto const II = get_symm<2>(surface_info.surf_vert_IIs, surf_vert);
      auto const II_decomp = decompose_eigen(II);
      Vector<2> m_ews;
      for (Int i = 0; i < 2; ++i) {
        m_ews[i] = square(II_decomp.l[i] / segment_angle);
      }
      auto const n = get_vector<3>(surface_info.surf_vert_normals, surf_vert);
      auto const frame = form_ortho_basis(n);
      Matrix<3, 2> surf_frame_t;
      surf_frame_t[0] = frame[1];
      surf_frame_t[1] = frame[2];
      auto const surf_frame = transpose(surf_frame_t);
      auto const m_q_inv = II_decomp.q * surf_frame;
      auto const m_q = pseudo_invert(m_q_inv);
      auto const m = m_q * diagonal(m_ews) * m_q_inv;
      auto const vert = surface_info.surf_vert2vert[surf_vert];
      set_symm(out, vert, m);
    };
    parallel_for(surface_info.surf_vert2vert.size(), std::move(f));
    get_curve_curvature_metrics<3>(surface_info, segment_angle, out);
  } else if (mesh->dim() == 2) {
    get_curve_curvature_metrics<2>(surface_info, segment_angle, out);
  }
  return out;
}